

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O0

ostream * __thiscall tchecker::ite_expression_t::output(ite_expression_t *this,ostream *os)

{
  expression_t *peVar1;
  ostream *os_local;
  ite_expression_t *this_local;
  
  std::operator<<(os,"if ");
  peVar1 = condition(this);
  (*peVar1->_vptr_expression_t[4])(peVar1,os);
  std::operator<<(os," then ");
  peVar1 = then_value(this);
  (*peVar1->_vptr_expression_t[4])(peVar1,os);
  std::operator<<(os," else ");
  peVar1 = else_value(this);
  (*peVar1->_vptr_expression_t[4])(peVar1,os);
  return os;
}

Assistant:

std::ostream & ite_expression_t::output(std::ostream & os) const
{
  os << "if ";
  condition().output(os);
  os << " then ";
  then_value().output(os);
  os << " else ";
  else_value().output(os);
  return os;
}